

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

Node * __thiscall spoa::Graph::Node::Successor(Node *this,uint32_t label)

{
  pointer ppEVar1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var2
  ;
  Edge **it;
  pointer ppEVar3;
  undefined1 local_24 [4];
  
  ppEVar3 = (this->outedges).
            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar1 = (this->outedges).
            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar3 != ppEVar1) {
    do {
      _Var2 = std::
              __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                        (((*ppEVar3)->labels).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         ((*ppEVar3)->labels).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish,local_24);
      if (_Var2._M_current !=
          ((*ppEVar3)->labels).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        return (*ppEVar3)->head;
      }
      ppEVar3 = ppEVar3 + 1;
    } while (ppEVar3 != ppEVar1);
  }
  return (Node *)0x0;
}

Assistant:

Graph::Node* Graph::Node::Successor(std::uint32_t label) const {
  for (const auto& it : outedges) {
    auto jt = std::find(it->labels.begin(), it->labels.end(), label);
    if (jt != it->labels.end()) {
      return it->head;
    }
  }
  return nullptr;
}